

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O2

qualified_column_set_t * __thiscall
duckdb::StarExpression::SerializedQualifiedExcludeList
          (qualified_column_set_t *__return_storage_ptr__,StarExpression *this)

{
  bool bVar1;
  __node_base *p_Var2;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  p_Var2 = &(this->exclude_list)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    bVar1 = QualifiedColumnName::IsQualified((QualifiedColumnName *)(p_Var2 + 1));
    if (bVar1) {
      ::std::__detail::
      _Insert_base<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)__return_storage_ptr__,(QualifiedColumnName *)(p_Var2 + 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

qualified_column_set_t StarExpression::SerializedQualifiedExcludeList() const {
	// we serialize only qualified elements in the qualified list for backwards compatibility
	qualified_column_set_t result;
	for (auto &entry : exclude_list) {
		if (entry.IsQualified()) {
			result.insert(entry);
		}
	}
	return result;
}